

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O0

ParsedSchemaList * __thiscall
capnp::ParsedSchema::getAllNested(ParsedSchemaList *__return_storage_ptr__,ParsedSchema *this)

{
  Reader list;
  ParsedSchema parent;
  Reader local_80;
  Reader local_50;
  Schema local_20;
  SchemaParser *local_18;
  ParsedSchema *local_10;
  ParsedSchema *this_local;
  
  local_20.raw = (this->super_Schema).raw;
  local_18 = this->parser;
  local_10 = this;
  Schema::getProto(&local_80,&this->super_Schema);
  capnp::schema::Node::Reader::getNestedNodes(&local_50,&local_80);
  parent.parser = local_18;
  parent.super_Schema.raw = local_20.raw;
  list.reader.capTable = local_50.reader.capTable;
  list.reader.segment = local_50.reader.segment;
  list.reader.ptr = local_50.reader.ptr;
  list.reader.elementCount = local_50.reader.elementCount;
  list.reader.step = local_50.reader.step;
  list.reader.structDataSize = local_50.reader.structDataSize;
  list.reader.structPointerCount = local_50.reader.structPointerCount;
  list.reader.elementSize = local_50.reader.elementSize;
  list.reader._39_1_ = local_50.reader._39_1_;
  list.reader.nestingLimit = local_50.reader.nestingLimit;
  list.reader._44_4_ = local_50.reader._44_4_;
  ParsedSchemaList::ParsedSchemaList(__return_storage_ptr__,parent,list);
  return __return_storage_ptr__;
}

Assistant:

ParsedSchema::ParsedSchemaList ParsedSchema::getAllNested() const {
  return ParsedSchemaList(*this, getProto().getNestedNodes());
}